

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_edge_curvature(REF_GEOM ref_geom,REF_INT geom,REF_DBL *k,REF_DBL *normal)

{
  REF_DBL *normal_local;
  REF_DBL *k_local;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  printf("curvature 0: No EGADS linked for %s\n","ref_egads_edge_curvature");
  *k = 0.0;
  *normal = 1.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_edge_curvature(REF_GEOM ref_geom, REF_INT geom,
                                            REF_DBL *k, REF_DBL *normal) {
#ifdef HAVE_EGADS
  double curvature[4];
  ego *edges;
  ego object;
  int edgeid;
  double t;
  int egads_status;
  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;
  REIS(REF_GEOM_EDGE, ref_geom_type(ref_geom, geom), "expected edge geom");
  RNS(ref_geom->edges, "edges not loaded");
  edgeid = ref_geom_id(ref_geom, geom);
  edges = (ego *)(ref_geom->edges);
  object = edges[edgeid - 1];
  RNS(object, "EGADS object is NULL. Has the geometry been loaded?");

  t = ref_geom_param(ref_geom, 0, geom); /* ignores periodic */

#if !defined(HAVE_EGADS_LITE) && defined(HAVE_EGADS_EFFECTIVE)
  if (ref_geom_effective(ref_geom) && !ref_geom_effective_curvature(ref_geom)) {
    ego underlying_object;
    double underlying_t;
    REIS(EGADS_SUCCESS,
         EG_effectiveMap(object, &t, &underlying_object, &underlying_t),
         "map effective to brep");
    object = underlying_object;
    t = underlying_t;
  }
#endif

  egads_status = EG_curvature(object, &t, curvature);
  if (EGADS_DEGEN == egads_status) {
    ego ref, *pchldrn;
    int oclass, mtype, nchild, *psens;
    double t_range[2];
    double t_offset;
    REF_DBL shift = 1.0e-2;
    REIS(EGADS_SUCCESS,
         EG_getTopology(object, &ref, &oclass, &mtype, t_range, &nchild,
                        &pchldrn, &psens),
         "EG topo face");
    t_offset = (1.0 - shift) * t + shift * 0.5 * (t_range[0] + t_range[1]);
    egads_status = EG_curvature(object, &t_offset, curvature);
  }
  if (EGADS_SUCCESS == egads_status) {
    *k = curvature[0];
    normal[0] = curvature[1];
    normal[1] = curvature[2];
    normal[2] = curvature[3];
    return REF_SUCCESS;
  }
  if (EGADS_NOTGEOM == egads_status) {
    /* EFFECTIVE */
    *k = 0;
    normal[0] = 1;
    normal[1] = 0;
    normal[2] = 0;
    return REF_SUCCESS;
  }
  printf("EG_curvature %d (-24 is DEGEN) edgeid %d t %e\n", egads_status,
         edgeid, t);
  *k = 0;
  normal[0] = 1;
  normal[1] = 0;
  normal[2] = 0;
  return REF_FAILURE;
#else
  printf("curvature 0: No EGADS linked for %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(geom);
  *k = 0.0;
  normal[0] = 1.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  return REF_IMPLEMENT;
#endif
}